

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

void __thiscall
directed_flag_complex_t::
do_for_each_cell<count_cells(filtered_directed_graph_t&,flagser_parameters_const&)::cell_counter_t>
          (directed_flag_complex_t *this,cell_counter_t *f,int min_dimension,int max_dimension,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
          vertex_index_t *prefix,unsigned_short prefix_size)

{
  ulong uVar1;
  bool bVar2;
  reference puVar3;
  int in_ECX;
  int in_EDX;
  directed_flag_complex_t *in_RSI;
  vertex_index_t *in_RDI;
  vertex_index_t *in_R8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_R9;
  unsigned_short unaff_retaddr;
  ushort in_stack_00000008;
  int b;
  size_t vertex_offset;
  size_t bits;
  size_t offset;
  unsigned_short v;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  unsigned_short vertex;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  uint in_stack_ffffffffffffff38;
  vertex_index_t in_stack_ffffffffffffff3c;
  vertex_index_t in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff50;
  short in_stack_ffffffffffffff52;
  int in_stack_ffffffffffffff54;
  ulong local_a0;
  ulong local_98;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_70 [5];
  unsigned_short local_42;
  unsigned_short *local_40;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_38;
  vertex_index_t *pvVar4;
  
  if (in_EDX + 1 <= (int)(uint)in_stack_00000008) {
    count_cells::cell_counter_t::operator()
              ((cell_counter_t *)
               CONCAT44(in_stack_ffffffffffffff54,
                        CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),in_RDI,
               in_stack_ffffffffffffff44);
  }
  if ((uint)in_stack_00000008 != in_ECX + 1U) {
    pvVar4 = in_R8;
    local_38._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    CONCAT26(in_stack_ffffffffffffff3e,
                             CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    local_40 = (unsigned_short *)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          CONCAT26(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT26(in_stack_ffffffffffffff3e,
                                          CONCAT24(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38))), bVar2) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_38);
      local_42 = *puVar3;
      *(unsigned_short *)
       ((long)&(in_R9->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start + (ulong)in_stack_00000008 * 2) = local_42;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13adee);
      if (in_stack_00000008 == 0) {
        for (local_98 = 0; local_98 < *(ulong *)(*(long *)in_RDI + 0xa0); local_98 = local_98 + 1) {
          local_a0 = directed_graph_t::get_outgoing_chunk
                               ((directed_graph_t *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                in_stack_ffffffffffffff3e,0x13af15);
          while (local_a0 != 0) {
            in_stack_ffffffffffffff54 = 0;
            for (uVar1 = local_a0; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
              in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1;
            }
            local_a0 = local_a0 & ~(1L << ((ulong)(byte)in_stack_ffffffffffffff54 & 0x3f));
            in_stack_ffffffffffffff52 = (short)(local_98 << 6) + (short)in_stack_ffffffffffffff54;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (value_type_conflict1 *)
                       CONCAT26(in_stack_ffffffffffffff3e,
                                CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
          }
        }
      }
      else {
        local_70[0]._M_current =
             (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        CONCAT26(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   CONCAT26(in_stack_ffffffffffffff3e,
                            CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)CONCAT26(in_stack_ffffffffffffff3e,
                                              CONCAT24(in_stack_ffffffffffffff3c,
                                                       in_stack_ffffffffffffff38))), bVar2) {
          puVar3 = __gnu_cxx::
                   __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator*(local_70);
          if (local_42 != *puVar3) {
            bVar2 = directed_graph_t::is_connected_by_an_edge
                              ((directed_graph_t *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c);
            in_stack_ffffffffffffff44 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff44);
            if (bVar2) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,
                                  CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                         in_RDI);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator++(local_70);
        }
      }
      in_stack_ffffffffffffff38 = (uint)(ushort)(in_stack_00000008 + 1);
      do_for_each_cell<count_cells(filtered_directed_graph_t&,flagser_parameters_const&)::cell_counter_t>
                (in_RSI,(cell_counter_t *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pvVar4 >> 0x20),
                 (int)pvVar4,in_R9,in_R8,unaff_retaddr);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)));
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void do_for_each_cell(Func& f, int min_dimension, int max_dimension,
	                      const std::vector<vertex_index_t>& possible_next_vertices, vertex_index_t* prefix,
	                      unsigned short prefix_size = 0) {
		// As soon as we have the correct dimension, execute f
		if (prefix_size >= min_dimension + 1) { f(prefix, prefix_size); }

		// If this is the last dimension we are interested in, exit this branch
		if (prefix_size == max_dimension + 1) return;

		for (auto vertex : possible_next_vertices) {
			// We can write the cell given by taking the current vertex as the maximal element
			prefix[prefix_size] = vertex;

			// And compute the next elements
			std::vector<vertex_index_t> new_possible_vertices;
			if (prefix_size > 0) {
				for (auto v : possible_next_vertices) {
					if (vertex != v && graph.is_connected_by_an_edge(vertex, v)) new_possible_vertices.push_back(v);
				}
			} else {
				// Get outgoing vertices of v in chunks of 64
				for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
					size_t bits = graph.get_outgoing_chunk(vertex, offset);

					size_t vertex_offset = offset << 6;
					while (bits > 0) {
						// Get the least significant non-zero bit
						auto b = __builtin_ctzl(bits);

						// Unset this bit
						bits &= ~(ONE_ << b);

						new_possible_vertices.push_back(vertex_index_t(vertex_offset + b));
					}
				}
			}

			do_for_each_cell(f, min_dimension, max_dimension, new_possible_vertices, prefix, prefix_size + 1);
		}
	}